

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::GetAttribute(Prim *prim,string *attr_name,Attribute *out_attr,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string *args;
  ostringstream ss_e_1;
  Property prop;
  string local_7c8;
  long *local_7a8 [2];
  long local_798 [2];
  long *local_788 [2];
  long local_778 [12];
  ios_base local_718 [264];
  undefined1 local_610 [128];
  bool local_590;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> vStack_588;
  AttrMetas AStack_570;
  Type local_364;
  
  if (out_attr == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetAttribute",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x7ea);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,"`out_attr` argument is nullptr.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_788[0]);
      if (local_788[0] != local_778) {
        operator_delete(local_788[0],local_778[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    ::std::ios_base::~ios_base((ios_base *)(local_610 + 0x70));
    return false;
  }
  Property::Property((Property *)local_610);
  args = err;
  bVar1 = GetProperty(prim,attr_name,(Property *)local_610,err);
  if (bVar1) {
    if (local_364 < Relation) {
      ::std::__cxx11::string::_M_assign((string *)out_attr);
      out_attr->_varying_authored = local_610[0x24];
      out_attr->_variability = local_610._32_4_;
      ::std::__cxx11::string::_M_assign((string *)&out_attr->_type_name);
      linb::any::operator=((any *)&out_attr->_var,(any *)(local_610 + 0x48));
      (out_attr->_var)._blocked = local_610[0x60];
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=(&(out_attr->_var)._ts._samples,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)(local_610 + 0x68));
      (out_attr->_var)._ts._dirty = local_590;
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&out_attr->_paths,
                 &vStack_588);
      AttrMetas::operator=(&out_attr->_metas,&AStack_570);
      bVar1 = true;
      goto LAB_0032b2c4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"GetAttribute",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_788,0x7f8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_7a8[0] = local_798;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"{} is not a Attribute.","");
    fmt::format<std::__cxx11::string>
              (&local_7c8,(fmt *)local_7a8,(string *)attr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_788,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    if (local_7a8[0] != local_798) {
      operator_delete(local_7a8[0],local_798[0] + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_7c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    ::std::ios_base::~ios_base(local_718);
  }
  bVar1 = false;
LAB_0032b2c4:
  Property::~Property((Property *)local_610);
  return bVar1;
}

Assistant:

bool GetAttribute(const tinyusdz::Prim &prim, const std::string &attr_name,
                  Attribute *out_attr, std::string *err) {
  if (!out_attr) {
    PUSH_ERROR_AND_RETURN("`out_attr` argument is nullptr.");
  }

  // First lookup as Property, then check if its Attribute
  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute()) {
    (*out_attr) = std::move(prop.get_attribute());
    return true;
  }

  PUSH_ERROR_AND_RETURN(fmt::format("{} is not a Attribute.", attr_name));
}